

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_client.cc
# Opt level: O3

void __thiscall common::SSH2Client::Login(SSH2Client *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Log *pLVar6;
  LIBSSH2_CHANNEL *channel;
  ssize_t sVar7;
  ssize_t sVar8;
  LIBSSH2_POLLFD fdp;
  winsize w_size;
  fd_set set;
  timeval timeval_out;
  char buffer [32000];
  LIBSSH2_POLLFD local_7df0;
  undefined8 local_7dd0;
  fd_set local_7dc8;
  timeval local_7d48;
  string local_7d38 [1000];
  
  pLVar6 = xlib::Log::Instance();
  paVar1 = &local_7d38[0].field_2;
  local_7d38[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d38,"[%v@%v:%v %v]\n","");
  xlib::Log::SWrite<std::__cxx11::string,std::__cxx11::string,unsigned_short,std::__cxx11::string>
            (pLVar6,LOG_PRIORITY_INFO,
             "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
             ,0x142,"Login",false,local_7d38,&this->m_user,&this->m_ip,&this->m_port,&this->m_alias)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d38[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_7d38[0]._M_dataplus._M_p);
  }
  channel = libssh2_channel_open_ex(this->session,"session",7,0x200000,0x8000,(char *)0x0,0);
  this->channel = channel;
  do {
    if (channel != (LIBSSH2_CHANNEL *)0x0) {
LAB_001106ab:
      iVar3 = libssh2_channel_request_pty_ex(channel,"xterm",5,(char *)0x0,0,0x50,0x18,0,0);
      if (iVar3 == 0) {
        iVar3 = libssh2_channel_process_startup(this->channel,"shell",5,(char *)0x0,0);
        if (iVar3 == 0) {
          iVar3 = RawMode(this);
          this->rc = iVar3;
          if (iVar3 == 0) {
            local_7dd0 = 0;
            iVar3 = fileno(_stdin);
            ioctl(iVar3,0x5413,&local_7dd0);
            if ((ushort)local_7dd0 != 0 || local_7dd0._2_2_ != 0) {
              libssh2_channel_request_pty_size_ex
                        (this->channel,(uint)local_7dd0._2_2_,(uint)(ushort)local_7dd0,0,0);
            }
            local_7df0.type = '\x02';
            local_7df0.fd = (anon_union_8_3_a559ac02_for_fd)this->channel;
            local_7df0.events = 1;
            local_7d48.tv_sec = 0;
            local_7d48.tv_usec = 0x32;
            do {
              do {
                local_7dc8.fds_bits[0xe] = 0;
                local_7dc8.fds_bits[0xf] = 0;
                local_7dc8.fds_bits[0xc] = 0;
                local_7dc8.fds_bits[0xd] = 0;
                local_7dc8.fds_bits[10] = 0;
                local_7dc8.fds_bits[0xb] = 0;
                local_7dc8.fds_bits[8] = 0;
                local_7dc8.fds_bits[9] = 0;
                local_7dc8.fds_bits[6] = 0;
                local_7dc8.fds_bits[7] = 0;
                local_7dc8.fds_bits[4] = 0;
                local_7dc8.fds_bits[5] = 0;
                local_7dc8.fds_bits[2] = 0;
                local_7dc8.fds_bits[3] = 0;
                local_7dc8.fds_bits[0] = 0;
                local_7dc8.fds_bits[1] = 0;
                iVar4 = fileno(_stdin);
                iVar5 = fileno(_stdin);
                iVar3 = iVar5 + 0x3f;
                if (-1 < iVar5) {
                  iVar3 = iVar5;
                }
                local_7dc8.fds_bits[iVar3 >> 6] =
                     local_7dc8.fds_bits[iVar3 >> 6] | 1L << ((byte)iVar4 & 0x3f);
                iVar3 = fileno(_stdin);
                iVar3 = select(iVar3 + 1,&local_7dc8,(fd_set *)0x0,(fd_set *)0x0,&local_7d48);
                this->rc = iVar3;
                if (0 < iVar3) {
                  iVar3 = fileno(_stdin);
                  sVar7 = read(iVar3,local_7d38,32000);
                  this->rc = (int)sVar7;
                  if (0 < (int)sVar7) {
                    do {
                      sVar8 = libssh2_channel_write_ex
                                        (this->channel,0,(char *)local_7d38,(long)this->rc);
                    } while ((int)sVar8 == -0x25);
                  }
                }
                iVar3 = libssh2_poll(&local_7df0,1,0);
                this->rc = iVar3;
              } while (iVar3 < 1);
              cVar2 = (char)local_7df0.revents;
              if ((local_7df0.revents & 1) != 0) {
                sVar8 = libssh2_channel_read_ex(this->channel,0,(char *)local_7d38,32000);
                write(1,local_7d38,(long)(int)sVar8);
                fflush(_stdout);
                cVar2 = (char)local_7df0.revents;
              }
            } while (-1 < cVar2);
            iVar3 = fileno(_stdin);
            tcsetattr(iVar3,1,(termios *)&this->saved_tio);
            return;
          }
          pLVar6 = xlib::Log::Instance();
          local_7d38[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_7d38,"raw mode error","");
          xlib::Log::SWrite<>(pLVar6,LOG_PRIORITY_FATAL,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                              ,0x155,"Login",true,local_7d38);
        }
        else {
          pLVar6 = xlib::Log::Instance();
          local_7d38[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_7d38,"open shell fail","")
          ;
          xlib::Log::SWrite<>(pLVar6,LOG_PRIORITY_FATAL,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                              ,0x151,"Login",true,local_7d38);
        }
      }
      else {
        pLVar6 = xlib::Log::Instance();
        local_7d38[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7d38,"request pty fail","");
        xlib::Log::SWrite<>(pLVar6,LOG_PRIORITY_FATAL,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                            ,0x14e,"Login",true,local_7d38);
      }
LAB_00110a27:
      std::__cxx11::string::~string((string *)local_7d38);
      exit(1);
    }
    iVar3 = libssh2_session_last_error(this->session,(char **)0x0,(int *)0x0,0);
    if (iVar3 != -0x25) {
      channel = this->channel;
      if (channel == (LIBSSH2_CHANNEL *)0x0) {
        pLVar6 = xlib::Log::Instance();
        local_7d38[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7d38,"channel null","");
        xlib::Log::SWrite<>(pLVar6,LOG_PRIORITY_FATAL,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                            ,0x149,"Login",true,local_7d38);
        goto LAB_00110a27;
      }
      goto LAB_001106ab;
    }
    waitsocket(this->sock,this->session);
    channel = libssh2_channel_open_ex(this->session,"session",7,0x200000,0x8000,(char *)0x0,0);
    this->channel = channel;
  } while( true );
}

Assistant:

void SSH2Client::Login() {
    XLOG("[%v@%v:%v %v]\n", m_user,  m_ip, m_port, m_alias);
    /* Exec non-blocking on the remove host */
    while ( (channel = libssh2_channel_open_session(session)) == NULL &&
           libssh2_session_last_error(session, NULL, NULL, 0) ==
           LIBSSH2_ERROR_EAGAIN ) {
        waitsocket(sock, session);
    }
    IF_XFATAL(channel == NULL, "channel null");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options
     */
    IF_XFATAL(libssh2_channel_request_pty(channel, "xterm"), "request pty fail");

    /* Open a SHELL on that pty */
    IF_XFATAL(libssh2_channel_shell(channel), "open shell fail");


    rc = RawMode();
    IF_XFATAL(rc != 0, "raw mode error");

    struct winsize w_size;
    struct winsize w_size_bck;
    memset(&w_size, 0, sizeof(struct winsize));
    memset(&w_size_bck, 0, sizeof(struct winsize));
    ioctl(fileno(stdin), TIOCGWINSZ, &w_size);
    if ((w_size.ws_row != w_size_bck.ws_row) ||
        (w_size.ws_col != w_size_bck.ws_col))   {
        w_size_bck = w_size;

        libssh2_channel_request_pty_size(channel,
                                         w_size.ws_col,
                                         w_size.ws_row);
    }

    LIBSSH2_POLLFD fdp;
    LIBSSH2_POLLFD* fds = &fdp;
    fds[0].type = LIBSSH2_POLLFD_CHANNEL;
    fds[0].fd.channel = channel;
    fds[0].events = LIBSSH2_POLLFD_POLLIN;

    char buffer[32000];

    struct timeval timeval_out;
    timeval_out.tv_sec = 0;
    timeval_out.tv_usec = 50;

    fd_set set;

    while (1) {
        FD_ZERO(&set);
        FD_SET(fileno(stdin), &set);

        rc = select(fileno(stdin)+1, &set, NULL, NULL, &timeval_out);
        if (rc > 0) {
            rc = read(fileno(stdin), buffer, sizeof(buffer));
            if (rc > 0) {
                int ret;
                while ((ret = libssh2_channel_write(channel, buffer, rc)) == LIBSSH2_ERROR_EAGAIN) {}
            }
        }
        rc = libssh2_poll(fds, 1, 0);
        if (rc < 1)
            continue;

        if (fds[0].revents & LIBSSH2_POLLFD_POLLIN) {
            int n = libssh2_channel_read(channel, buffer, sizeof(buffer));
            write(1, buffer, n);
            fflush(stdout);
        }

        if (fds[0].revents & LIBSSH2_POLLFD_CHANNEL_CLOSED) {
            // fprintf(stdout, "%s\n", "closed");
            break;
        }
    }
    NormalMode();
}